

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O1

bool Diligent::ShaderSerializer<(Diligent::SerializerMode)2>::SerializeCI
               (Serializer<(Diligent::SerializerMode)2> *Ser,ConstQual<ShaderCreateInfo> *CI)

{
  TEnableStr<const_char_*> TVar1;
  bool bVar2;
  
  TVar1 = Serializer<(Diligent::SerializerMode)2>::Serialize<char_const*>
                    (Ser,(CI->Desc).super_DeviceObjectAttribs.Name);
  if (TVar1) {
    bVar2 = Serializer<(Diligent::SerializerMode)2>::operator()
                      (Ser,&(CI->Desc).ShaderType,&(CI->Desc).UseCombinedTextureSamplers,
                       &(CI->Desc).CombinedSamplerSuffix,&CI->EntryPoint,&CI->SourceLanguage,
                       &CI->ShaderCompiler,&CI->HLSLVersion,&CI->GLSLVersion,&CI->GLESSLVersion,
                       &CI->MSLVersion,&CI->CompileFlags,&CI->LoadConstantBufferReflection,
                       &CI->GLSLExtensions,&CI->WebGPUEmulatedArrayIndexSuffix);
    if (bVar2) {
      bVar2 = SerializeBytecodeOrSource(Ser,CI);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool ShaderSerializer<Mode>::SerializeCI(Serializer<Mode>&            Ser,
                                         ConstQual<ShaderCreateInfo>& CI)
{
    if (!Ser(CI.Desc.Name,
             CI.Desc.ShaderType,
             CI.Desc.UseCombinedTextureSamplers,
             CI.Desc.CombinedSamplerSuffix,
             CI.EntryPoint,
             CI.SourceLanguage,
             CI.ShaderCompiler,
             CI.HLSLVersion,
             CI.GLSLVersion,
             CI.GLESSLVersion,
             CI.MSLVersion,
             CI.CompileFlags,
             CI.LoadConstantBufferReflection,
             CI.GLSLExtensions,
             CI.WebGPUEmulatedArrayIndexSuffix))
        return false;

    return SerializeBytecodeOrSource(Ser, CI);

    ASSERT_SIZEOF64(ShaderCreateInfo, 152, "Did you add a new member to ShaderCreateInfo? Please add serialization here.");
}